

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

ExprPtr __thiscall pegmatite::operator>>(pegmatite *this,ExprPtr *left,ExprPtr *right)

{
  BinaryExpr *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  __shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (BinaryExpr *)operator_new(0x28);
  std::__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,(__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> *)left);
  std::__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,(__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> *)right);
  anon_unknown.dwarf_4ffb8::BinaryExpr::BinaryExpr
            (this_00,(ExprPtr *)&local_38,(ExprPtr *)&_Stack_48);
  (this_00->super_Expr)._vptr_Expr = (_func_int **)&PTR__BinaryExpr_00165fb0;
  std::__shared_ptr<pegmatite::Expr,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pegmatite::Expr,void>
            ((__shared_ptr<pegmatite::Expr,(__gnu_cxx::_Lock_policy)2> *)this,(Expr *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar1.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator >> (const ExprPtr &left, const ExprPtr &right)
{
	return ExprPtr(new SequenceExpr(left, right));
}